

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O3

uint64_t filemgr_fetch_prev_header
                   (filemgr *file,uint64_t bid,void *buf,size_t *len,fdb_seqnum_t *seqnum,
                   filemgr_header_revnum_t *revnum,uint64_t *deltasize,uint64_t *version,
                   uint64_t *sb_bmp_revnum,err_log_callback *log_callback)

{
  ushort uVar1;
  ulong uVar2;
  bool bVar3;
  fdb_status fVar4;
  void *buf_00;
  uint64_t uVar5;
  ulong __n;
  ulong uVar6;
  fdb_log_levels given_log_level;
  ulong uVar7;
  size_t line_number;
  char *format;
  ulong uVar8;
  ulong uVar9;
  
  *len = 0;
  if (bid + 1 < 2) {
    return bid;
  }
  buf_00 = _filemgr_get_temp_buf();
  fVar4 = filemgr_read(file,bid,buf_00,log_callback,true);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    if (*(char *)((long)buf_00 + ((ulong)file->blocksize - 1)) == -0x12) {
      uVar6 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 9));
      bVar3 = ver_is_valid_magic(uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 |
                                 (uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 |
                                 (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
                                 (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38);
      if (!bVar3) goto LAB_0012739c;
      uVar1 = *(ushort *)((long)buf_00 + ((ulong)file->blocksize - 0xb));
      uVar6 = *(ulong *)((long)buf_00 + (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8));
      uVar9 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
      if (((file->sb != (superblock *)0x0) &&
          ((file->sb->bmp_size).super___atomic_base<unsigned_long>._M_i != 0)) &&
         (uVar5 = (*sb_ops.get_min_live_revnum)(file), uVar9 <= uVar5)) goto LAB_00127307;
      uVar6 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 0x13));
      uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18
              | (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18
              | (uVar6 & 0xff00) << 0x28 | uVar6 << 0x38;
    }
    else {
LAB_0012739c:
      if (((file->header).size == 0) ||
         (uVar6 = (file->header).bid.super___atomic_base<unsigned_long>._M_i, bid <= uVar6))
      goto LAB_00127307;
      uVar9 = (file->header).revnum + 1;
    }
    fVar4 = filemgr_read(file,uVar6,buf_00,log_callback,true);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      if (*(char *)((long)buf_00 + ((ulong)file->blocksize - 1)) == -0x12) {
        uVar7 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 9));
        uVar7 = uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28 |
                uVar7 << 0x38;
        bVar3 = ver_is_valid_magic(uVar7);
        if (bVar3) {
          uVar1 = *(ushort *)((long)buf_00 + ((ulong)file->blocksize - 0xb));
          __n = (ulong)(ushort)(uVar1 << 8 | uVar1 >> 8);
          if (buf != (void *)0x0) {
            memcpy(buf,buf_00,__n);
          }
          uVar8 = *(ulong *)((long)buf_00 + __n);
          uVar8 = uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 |
                  (uVar8 & 0xff0000000000) >> 0x18 | (uVar8 & 0xff00000000) >> 8 |
                  (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 | (uVar8 & 0xff00) << 0x28
                  | uVar8 << 0x38;
          if ((uVar8 < uVar9) && (uVar5 = (*sb_ops.get_min_live_revnum)(file), uVar5 <= uVar8)) {
            uVar9 = *(ulong *)((long)buf_00 + __n + 8);
            bVar3 = ver_is_atleast_magic_001(uVar7);
            if ((deltasize != (uint64_t *)0x0) && (bVar3)) {
              uVar2 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 0x1b));
              *deltasize = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                           (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                           (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                           (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            }
            if ((sb_bmp_revnum != (uint64_t *)0x0) && (bVar3 = ver_superblock_support(uVar7), bVar3)
               ) {
              uVar2 = *(ulong *)((long)buf_00 + ((ulong)file->blocksize - 0x23));
              *sb_bmp_revnum =
                   uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                   (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                   (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                   | uVar2 << 0x38;
            }
            if (revnum != (filemgr_header_revnum_t *)0x0) {
              *revnum = uVar8;
            }
            *seqnum = uVar9 >> 0x38 | (uVar9 & 0xff000000000000) >> 0x28 |
                      (uVar9 & 0xff0000000000) >> 0x18 | (uVar9 & 0xff00000000) >> 8 |
                      (uVar9 & 0xff000000) << 8 | (uVar9 & 0xff0000) << 0x18 |
                      (uVar9 & 0xff00) << 0x28 | uVar9 << 0x38;
            *len = __n;
            *version = uVar7;
            goto LAB_00127315;
          }
        }
        else {
          fdb_log_impl(log_callback,3,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_fetch_prev_header",0x577,
                       "A block magic value of %lu of the previous database header block id %lu in a database file \'%s\' does NOT match FILEMGR_MAGIC %lu!"
                       ,uVar7,uVar6,file->filename,0xdeadcafebeefc002);
        }
      }
      else if (uVar6 != 0) {
        format = 
        "A block marker of the previous database header block id %lu in a database file \'%s\' does NOT match BLK_MARKER_DBHEADER!"
        ;
        given_log_level = 5;
        line_number = 0x567;
        fVar4 = FDB_RESULT_FILE_CORRUPTION;
        goto LAB_00127407;
      }
    }
    else {
      format = 
      "Failed to read a previous database header with block id %lu in a database file \'%s\'";
      given_log_level = 3;
      line_number = 0x55a;
LAB_00127407:
      fdb_log_impl(log_callback,given_log_level,fVar4,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_fetch_prev_header",line_number,format,uVar6,file->filename);
    }
  }
LAB_00127307:
  *len = 0;
  uVar6 = 0xffffffffffffffff;
LAB_00127315:
  _filemgr_release_temp_buf(buf_00);
  return uVar6;
}

Assistant:

uint64_t filemgr_fetch_prev_header(struct filemgr *file, uint64_t bid,
                                   void *buf, size_t *len, fdb_seqnum_t *seqnum,
                                   filemgr_header_revnum_t *revnum,
                                   uint64_t *deltasize, uint64_t *version,
                                   uint64_t *sb_bmp_revnum,
                                   err_log_callback *log_callback)
{
    uint8_t *_buf;
    uint8_t marker[BLK_MARKER_SIZE];
    fdb_seqnum_t _seqnum;
    filemgr_header_revnum_t _revnum, cur_revnum, prev_revnum;
    filemgr_header_len_t hdr_len;
    filemgr_magic_t magic;
    bid_t _prev_bid, prev_bid;
    uint64_t _deltasize, _bmp_revnum;
    int found = 0;

    *len = 0;

    if (!bid || bid == BLK_NOT_FOUND) {
        // No other header available
        return bid;
    }
    _buf = (uint8_t *)_filemgr_get_temp_buf();

    // Reverse scan the file for a previous DB header
    do {
        // Get prev_bid from the current header.
        // Since the current header is already cached during the previous
        // operation, no disk I/O will be triggered.
        if (filemgr_read(file, (bid_t)bid, _buf, log_callback, true)
                != FDB_RESULT_SUCCESS) {
            break;
        }

        memcpy(marker, _buf + file->blocksize - BLK_MARKER_SIZE,
               BLK_MARKER_SIZE);
        memcpy(&magic,
               _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic),
               sizeof(magic));
        magic = _endian_decode(magic);

        if (marker[0] != BLK_MARKER_DBHEADER ||
            !ver_is_valid_magic(magic)) {
            // not a header block
            // this happens when this function is invoked between
            // fdb_set() call and fdb_commit() call, so the last block
            // in the file is not a header block
            bid_t latest_hdr = filemgr_get_header_bid(file);
            if (latest_hdr != BLK_NOT_FOUND && bid > latest_hdr) {
                // get the latest header BID
                bid = latest_hdr;
            } else {
                break;
            }
            cur_revnum = file->header.revnum + 1;
        } else {

            memcpy(&hdr_len,
                   _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
                   sizeof(hdr_len), sizeof(hdr_len));
            hdr_len = _endian_decode(hdr_len);

            memcpy(&_revnum, _buf + hdr_len,
                   sizeof(filemgr_header_revnum_t));
            cur_revnum = _endian_decode(_revnum);

            if (sb_bmp_exists(file->sb)) {
                // first check revnum
                if (cur_revnum <= sb_ops.get_min_live_revnum(file)) {
                    // previous headers already have been reclaimed
                    // no more logical prev header
                    break;
                }
            }

            memcpy(&_prev_bid,
                   _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
                       sizeof(hdr_len) - sizeof(_prev_bid),
                   sizeof(_prev_bid));
            prev_bid = _endian_decode(_prev_bid);
            bid = prev_bid;
        }

        // Read the prev header
        fdb_status fs = filemgr_read(file, (bid_t)bid, _buf, log_callback, true);
        if (fs != FDB_RESULT_SUCCESS) {
            fdb_log(log_callback, FDB_LOG_WARNING, fs,
                    "Failed to read a previous database header with block id %"
                    _F64 " in "
                    "a database file '%s'", bid, file->filename);
            break;
        }

        memcpy(marker, _buf + file->blocksize - BLK_MARKER_SIZE,
               BLK_MARKER_SIZE);
        if (marker[0] != BLK_MARKER_DBHEADER) {
            if (bid) {
                // broken linked list
                fdb_log(log_callback, FDB_LOG_DEBUG, FDB_RESULT_FILE_CORRUPTION,
                        "A block marker of the previous database header block id %"
                        _F64 " in "
                        "a database file '%s' does NOT match BLK_MARKER_DBHEADER!",
                        bid, file->filename);
            }
            break;
        }

        memcpy(&magic,
               _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic),
               sizeof(magic));
        magic = _endian_decode(magic);
        if (!ver_is_valid_magic(magic)) {
            // broken linked list
            fdb_log(log_callback, FDB_LOG_WARNING, FDB_RESULT_FILE_CORRUPTION,
                    "A block magic value of %" _F64
                    " of the previous database header block id %" _F64 " in "
                    "a database file '%s' does NOT match FILEMGR_MAGIC %"
                    _F64"!", magic,
                    bid, file->filename, ver_get_latest_magic());
            break;
        }

        memcpy(&hdr_len,
               _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
               sizeof(hdr_len), sizeof(hdr_len));
        hdr_len = _endian_decode(hdr_len);

        if (buf) {
            memcpy(buf, _buf, hdr_len);
        }
        memcpy(&_revnum, _buf + hdr_len,
               sizeof(filemgr_header_revnum_t));
        prev_revnum = _endian_decode(_revnum);
        if (prev_revnum >= cur_revnum ||
            prev_revnum < sb_ops.get_min_live_revnum(file)) {
            // no more prev header, or broken linked list
            break;
        }

        memcpy(&_seqnum,
               _buf + hdr_len + sizeof(filemgr_header_revnum_t),
               sizeof(fdb_seqnum_t));
        if (ver_is_atleast_magic_001(magic)) {
            if (deltasize) {
                memcpy(&_deltasize,
                        _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic)
                       - sizeof(hdr_len) - sizeof(prev_bid) - sizeof(_deltasize),
                        sizeof(_deltasize));
                *deltasize = _endian_decode(_deltasize);
            }
        }

        if (sb_bmp_revnum && ver_superblock_support(magic)) {
            memcpy(&_bmp_revnum, _buf + file->blocksize - BLK_MARKER_SIZE
                    - sizeof(magic) - sizeof(hdr_len) - sizeof(bid)
                    - sizeof(_deltasize) - sizeof(_bmp_revnum), sizeof(_bmp_revnum));
            *sb_bmp_revnum = _endian_decode(_bmp_revnum);
        }

        if (revnum) {
            *revnum = prev_revnum;
        }
        *seqnum = _endian_decode(_seqnum);
        *len = hdr_len;
        *version = magic;
        found = 1;
        break;
    } while (false); // no repetition

    if (!found) { // no other header found till end of file
        *len = 0;
        bid = BLK_NOT_FOUND;
    }

    _filemgr_release_temp_buf(_buf);

    return bid;
}